

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O3

char * get_backup_path(char *romfile)

{
  long lVar1;
  gbamem_t *pgVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char **ppcVar7;
  _Bool enable_graphics;
  char *filename;
  long lVar8;
  char buf [4096];
  char acStack_2030 [4096];
  char acStack_1018 [4104];
  
  pcVar6 = acStack_1018;
  pcVar4 = realpath(romfile,acStack_1018);
  sVar5 = strlen(pcVar4);
  iVar3 = (int)sVar5 + 8;
  if (iVar3 < 0x1000) {
    pcVar4 = (char *)malloc((long)iVar3);
    snprintf(pcVar4,(long)iVar3,"%s.backup",acStack_1018);
    return pcVar4;
  }
  get_backup_path_cold_1();
  filename = acStack_2030;
  pcVar4 = realpath(pcVar4,acStack_2030);
  sVar5 = strlen(pcVar4);
  iVar3 = (int)sVar5 + 9;
  if (iVar3 < 0x1000) {
    pcVar4 = (char *)malloc((long)iVar3);
    snprintf(pcVar4,(long)iVar3,"%s.%02d.save",acStack_2030,(ulong)pcVar6 & 0xffffffff);
    return pcVar4;
  }
  get_savestate_path_cold_1();
  mem = init_mem();
  load_gbarom(pcVar4);
  pcVar6 = get_backup_path(pcVar4);
  pgVar2 = mem;
  mem->backup_path = pcVar6;
  ppcVar7 = (char **)malloc(0x50);
  pgVar2->savestate_path = ppcVar7;
  lVar8 = 0;
  do {
    lVar1 = lVar8 + 1;
    pcVar6 = get_savestate_path(pcVar4,(int)lVar1);
    mem->savestate_path[lVar8] = pcVar6;
    lVar8 = lVar1;
  } while (lVar1 != 10);
  if (filename != (char *)0x0) {
    load_alternate_bios(filename);
  }
  cpu = init_arm7tdmi(gba_read_byte,gba_read_half,gba_read_word,gba_write_byte,gba_write_half,
                      gba_write_word);
  fill_pipe(cpu);
  ppu = init_ppu(enable_graphics);
  bus = init_gbabus();
  apu = init_apu(enable_graphics);
  return (char *)apu;
}

Assistant:

const char* get_backup_path(const char* romfile) {
    char buf[PATH_MAX];
    char* rom_path = portable_realpath(romfile, buf);
    int backup_path_buf_size = strlen(rom_path) + 8; // .backup + null terminator

    if (backup_path_buf_size >= PATH_MAX) {
        logfatal("Backup path too long! How deeply are you nesting your directories?")
    }

    char* backuppath = malloc(backup_path_buf_size);
    snprintf(backuppath, backup_path_buf_size, "%s.backup", buf);
    return backuppath;
}